

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O2

int __thiscall FWeaponSlots::RestoreSlots(FWeaponSlots *this,FConfigFile *config,char *section)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  int local_54;
  FString section_name;
  char *value;
  char *key;
  
  FString::FString(&section_name,section);
  FString::operator+=(&section_name,".Weapons");
  local_54 = 0;
  bVar2 = FConfigFile::SetSection(config,section_name.Chars,false);
  if (bVar2) {
    local_54 = 0;
    while (bVar2 = FConfigFile::NextInSection(config,&key,&value), pcVar1 = key, bVar2) {
      iVar3 = strncasecmp(key,"Slot[",5);
      if ((((iVar3 == 0) && (0xf4 < (byte)(pcVar1[5] - 0x3bU))) && (pcVar1[6] == ']')) &&
         (pcVar1[7] == '\0')) {
        FWeaponSlot::AddWeaponList(this->Slots + (byte)(pcVar1[5] - 0x30),value,true);
        local_54 = local_54 + 1;
      }
    }
  }
  FString::~FString(&section_name);
  return local_54;
}

Assistant:

int FWeaponSlots::RestoreSlots(FConfigFile *config, const char *section)
{
	FString section_name(section);
	const char *key, *value;
	int slotsread = 0;

	section_name += ".Weapons";
	if (!config->SetSection(section_name))
	{
		return 0;
	}
	while (config->NextInSection (key, value))
	{
		if (strnicmp (key, "Slot[", 5) != 0 ||
			key[5] < '0' ||
			key[5] > '0'+NUM_WEAPON_SLOTS ||
			key[6] != ']' ||
			key[7] != 0)
		{
			continue;
		}
		Slots[key[5] - '0'].AddWeaponList(value, true);
		slotsread++;
	}
	return slotsread;
}